

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O3

Texture2D *
glu::Texture2D::create
          (RenderContext *context,ContextInfo *contextInfo,Archive *archive,int numLevels,
          char **levelFileNames)

{
  EVP_PKEY_CTX *dst;
  pointer pPVar1;
  int iVar2;
  Texture2D *this;
  TestError *this_00;
  InternalError *this_01;
  char **ppcVar3;
  undefined1 *puVar4;
  long lVar5;
  bool bVar6;
  vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> levels;
  string ext;
  undefined1 local_b0 [40];
  undefined1 *local_88;
  Texture2D *local_80;
  string local_78;
  PixelBufferAccess local_58;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,*levelFileNames,(allocator<char> *)&local_58);
  de::FilePath::getFileExtension_abi_cxx11_(&local_78,(FilePath *)local_b0);
  if (local_b0._0_8_ != (long)local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,(ulong)((long)(CompressedTexFormat *)local_b0._16_8_ + 1)
                   );
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_78);
  if (iVar2 == 0) {
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_b0);
    tcu::ImageIO::loadPNG((TextureLevel *)local_b0,archive,*levelFileNames);
    bVar6 = (local_b0._0_8_ & 0xffffffff00000000) == 0x300000000;
    if ((!bVar6) || (1 < (ChannelOrder)local_b0._0_8_ - RGB)) {
      this_01 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_01,(char *)0x0,
                 "level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) || level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8)"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0xe6);
      __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    this = (Texture2D *)operator_new(0x70);
    Texture2D(this,context,((ChannelOrder)local_b0._0_8_ == RGBA && bVar6) + 0x1907,0x1401,
              local_b0._8_4_,local_b0._12_4_);
    local_80 = &this->m_refTexture;
    tcu::Texture2D::allocLevel(local_80,0);
    dst = (EVP_PKEY_CTX *)
          (this->m_refTexture).super_TextureLevelPyramid.m_access.
          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
          _M_impl.super__Vector_impl_data._M_start;
    tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)local_b0);
    tcu::copy(dst,(EVP_PKEY_CTX *)&local_58);
    if (1 < numLevels) {
      ppcVar3 = levelFileNames + 1;
      local_88 = (undefined1 *)((ulong)(uint)numLevels * 0x28);
      iVar2 = 1;
      puVar4 = &DAT_00000028;
      do {
        tcu::ImageIO::loadPNG((TextureLevel *)local_b0,archive,*ppcVar3);
        tcu::Texture2D::allocLevel(local_80,iVar2);
        pPVar1 = (this->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)local_b0);
        tcu::copy((EVP_PKEY_CTX *)(puVar4 + (long)pPVar1),(EVP_PKEY_CTX *)&local_58);
        iVar2 = iVar2 + 1;
        puVar4 = puVar4 + 0x28;
        ppcVar3 = ppcVar3 + 1;
      } while (local_88 != puVar4);
    }
    (*this->_vptr_Texture2D[2])(this);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_b0);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_78);
    if (iVar2 != 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unsupported file format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x110);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::vector
              ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)local_b0,
               (long)numLevels,(allocator_type *)&local_58);
    if (0 < numLevels) {
      lVar5 = 0;
      do {
        tcu::ImageIO::loadPKM((CompressedTexture *)(local_b0._0_8_ + lVar5),archive,*levelFileNames)
        ;
        lVar5 = lVar5 + 0x28;
        levelFileNames = levelFileNames + 1;
      } while ((ulong)(uint)numLevels * 0x28 != lVar5);
    }
    this = (Texture2D *)operator_new(0x70);
    local_58.super_ConstPixelBufferAccess.m_format.order = I;
    Texture2D(this,context,contextInfo,numLevels,(CompressedTexture *)local_b0._0_8_,
              (TexDecompressionParams *)&local_58);
    std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::~vector
              ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

Texture2D* Texture2D::create (const RenderContext& context, const ContextInfo& contextInfo, const tcu::Archive& archive, int numLevels, const char* const* levelFileNames)
{
	DE_ASSERT(numLevels > 0);

	std::string ext = de::FilePath(levelFileNames[0]).getFileExtension();

	if (ext == "png")
	{
		// Uncompressed texture.

		tcu::TextureLevel level;

		// Load level 0.
		tcu::ImageIO::loadPNG(level, archive, levelFileNames[0]);

		TCU_CHECK_INTERNAL(level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) ||
						   level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8));

		bool		isRGBA		= level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);
		Texture2D*	texture		= new Texture2D(context, isRGBA ? GL_RGBA : GL_RGB, GL_UNSIGNED_BYTE, level.getWidth(), level.getHeight());

		try
		{
			// Fill level 0.
			texture->getRefTexture().allocLevel(0);
			tcu::copy(texture->getRefTexture().getLevel(0), level.getAccess());

			// Fill remaining levels.
			for (int levelNdx = 1; levelNdx < numLevels; levelNdx++)
			{
				tcu::ImageIO::loadPNG(level, archive, levelFileNames[levelNdx]);

				texture->getRefTexture().allocLevel(levelNdx);
				tcu::copy(texture->getRefTexture().getLevel(levelNdx), level.getAccess());
			}

			// Upload data.
			texture->upload();
		}
		catch (const std::exception&)
		{
			delete texture;
			throw;
		}

		return texture;
	}
	else if (ext == "pkm")
	{
		// Compressed texture.
		vector<tcu::CompressedTexture> levels(numLevels);

		for (int ndx = 0; ndx < numLevels; ndx++)
			tcu::ImageIO::loadPKM(levels[ndx], archive, levelFileNames[ndx]);

		return new Texture2D(context, contextInfo, numLevels, &levels[0]);
	}
	else
		TCU_FAIL("Unsupported file format");
}